

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

mpc_parser_t * mpc_check_with(mpc_parser_t *a,mpc_dtor_t da,mpc_check_with_t f,void *x,char *e)

{
  mpc_parser_t *pmVar1;
  size_t sVar2;
  char *pcVar3;
  mpc_parser_t *p;
  char *e_local;
  void *x_local;
  mpc_check_with_t f_local;
  mpc_dtor_t da_local;
  mpc_parser_t *a_local;
  
  pmVar1 = mpc_undefined();
  pmVar1->type = '\x1a';
  (pmVar1->data).expect.x = a;
  (pmVar1->data).check.dx = da;
  (pmVar1->data).check_with.f = f;
  (pmVar1->data).check_with.d = x;
  sVar2 = strlen(e);
  pcVar3 = (char *)malloc(sVar2 + 1);
  (pmVar1->data).check_with.e = pcVar3;
  strcpy((pmVar1->data).check_with.e,e);
  return pmVar1;
}

Assistant:

mpc_parser_t *mpc_check_with(mpc_parser_t *a, mpc_dtor_t da, mpc_check_with_t f, void *x, const char *e) {
  mpc_parser_t  *p = mpc_undefined();
  p->type = MPC_TYPE_CHECK_WITH;
  p->data.check_with.x = a;
  p->data.check_with.dx = da;
  p->data.check_with.f = f;
  p->data.check_with.d = x;
  p->data.check_with.e = malloc(strlen(e) + 1);
  strcpy(p->data.check_with.e, e);
  return p;
}